

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O1

POOL_ctx * POOL_create_advanced(size_t numThreads,size_t queueSize,ZSTD_customMem customMem)

{
  int iVar1;
  int iVar2;
  int iVar3;
  POOL_ctx *ctx;
  POOL_job *__s;
  pthread_t *__s_00;
  size_t sVar4;
  size_t sVar5;
  long lVar6;
  
  if (numThreads != 0) {
    if (customMem.customAlloc == (ZSTD_allocFunction)0x0) {
      ctx = (POOL_ctx *)calloc(1,0xf0);
    }
    else {
      ctx = (POOL_ctx *)(*customMem.customAlloc)(customMem.opaque,0xf0);
      memset(ctx,0,0xf0);
    }
    if (ctx != (POOL_ctx *)0x0) {
      sVar5 = (queueSize + 1) * 0x10;
      ctx->queueSize = queueSize + 1;
      if (customMem.customAlloc == (ZSTD_allocFunction)0x0) {
        __s = (POOL_job *)calloc(1,sVar5);
      }
      else {
        __s = (POOL_job *)(*customMem.customAlloc)(customMem.opaque,sVar5);
        memset(__s,0,sVar5);
      }
      ctx->queue = __s;
      ctx->numThreadsBusy = 0;
      ctx->queueHead = 0;
      ctx->queueTail = 0;
      ctx->queueEmpty = 1;
      iVar1 = pthread_mutex_init((pthread_mutex_t *)&ctx->queueMutex,(pthread_mutexattr_t *)0x0);
      iVar2 = pthread_cond_init((pthread_cond_t *)&ctx->queuePushCond,(pthread_condattr_t *)0x0);
      iVar3 = pthread_cond_init((pthread_cond_t *)&ctx->queuePopCond,(pthread_condattr_t *)0x0);
      if (iVar3 == 0 && (iVar2 == 0 && iVar1 == 0)) {
        ctx->shutdown = 0;
        sVar5 = numThreads * 8;
        if (customMem.customAlloc == (ZSTD_allocFunction)0x0) {
          __s_00 = (pthread_t *)calloc(1,sVar5);
        }
        else {
          __s_00 = (pthread_t *)(*customMem.customAlloc)(customMem.opaque,sVar5);
          memset(__s_00,0,sVar5);
        }
        ctx->threads = __s_00;
        ctx->threadCapacity = 0;
        (ctx->customMem).customAlloc = customMem.customAlloc;
        (ctx->customMem).customFree = customMem.customFree;
        (ctx->customMem).opaque = customMem.opaque;
        if ((__s_00 != (pthread_t *)0x0) && (ctx->queue != (POOL_job *)0x0)) {
          lVar6 = 0;
          sVar4 = 0;
          while (iVar1 = pthread_create((pthread_t *)((long)ctx->threads + lVar6),
                                        (pthread_attr_t *)0x0,POOL_thread,ctx), iVar1 == 0) {
            sVar4 = sVar4 + 1;
            lVar6 = lVar6 + 8;
            if (numThreads + (numThreads == 0) == sVar4) {
              ctx->threadCapacity = numThreads;
              ctx->threadLimit = numThreads;
              return ctx;
            }
          }
          ctx->threadCapacity = sVar4;
        }
      }
      POOL_free(ctx);
    }
  }
  return (POOL_ctx *)0x0;
}

Assistant:

POOL_ctx* POOL_create_advanced(size_t numThreads, size_t queueSize,
                               ZSTD_customMem customMem)
{
    POOL_ctx* ctx;
    /* Check parameters */
    if (!numThreads) { return NULL; }
    /* Allocate the context and zero initialize */
    ctx = (POOL_ctx*)ZSTD_customCalloc(sizeof(POOL_ctx), customMem);
    if (!ctx) { return NULL; }
    /* Initialize the job queue.
     * It needs one extra space since one space is wasted to differentiate
     * empty and full queues.
     */
    ctx->queueSize = queueSize + 1;
    ctx->queue = (POOL_job*)ZSTD_customCalloc(ctx->queueSize * sizeof(POOL_job), customMem);
    ctx->queueHead = 0;
    ctx->queueTail = 0;
    ctx->numThreadsBusy = 0;
    ctx->queueEmpty = 1;
    {
        int error = 0;
        error |= ZSTD_pthread_mutex_init(&ctx->queueMutex, NULL);
        error |= ZSTD_pthread_cond_init(&ctx->queuePushCond, NULL);
        error |= ZSTD_pthread_cond_init(&ctx->queuePopCond, NULL);
        if (error) { POOL_free(ctx); return NULL; }
    }
    ctx->shutdown = 0;
    /* Allocate space for the thread handles */
    ctx->threads = (ZSTD_pthread_t*)ZSTD_customCalloc(numThreads * sizeof(ZSTD_pthread_t), customMem);
    ctx->threadCapacity = 0;
    ctx->customMem = customMem;
    /* Check for errors */
    if (!ctx->threads || !ctx->queue) { POOL_free(ctx); return NULL; }
    /* Initialize the threads */
    {   size_t i;
        for (i = 0; i < numThreads; ++i) {
            if (ZSTD_pthread_create(&ctx->threads[i], NULL, &POOL_thread, ctx)) {
                ctx->threadCapacity = i;
                POOL_free(ctx);
                return NULL;
        }   }
        ctx->threadCapacity = numThreads;
        ctx->threadLimit = numThreads;
    }
    return ctx;
}